

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

bool Catch::operator==(Optional<Catch::ColourMode> *a,Optional<Catch::ColourMode> *b)

{
  ColourMode CVar1;
  bool bVar2;
  ColourMode *pCVar3;
  Optional<Catch::ColourMode> *b_local;
  Optional<Catch::ColourMode> *a_local;
  
  bVar2 = Optional<Catch::ColourMode>::none(a);
  if ((bVar2) && (bVar2 = Optional<Catch::ColourMode>::none(b), bVar2)) {
    a_local._7_1_ = true;
  }
  else {
    bVar2 = Optional<Catch::ColourMode>::some(a);
    if ((bVar2) && (bVar2 = Optional<Catch::ColourMode>::some(b), bVar2)) {
      pCVar3 = Optional<Catch::ColourMode>::operator*(a);
      CVar1 = *pCVar3;
      pCVar3 = Optional<Catch::ColourMode>::operator*(b);
      a_local._7_1_ = CVar1 == *pCVar3;
    }
    else {
      a_local._7_1_ = false;
    }
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(Optional const& a, Optional const& b) {
            if (a.none() && b.none()) {
                return true;
            } else if (a.some() && b.some()) {
                return *a == *b;
            } else {
                return false;
            }
        }